

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>
                  *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->b).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->b).d.d)->super_QArrayData,1,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>
                     *)this);
  return;
}

Assistant:

~QStringBuilder() = default;